

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Loop::ComputeLoopStructuredOrder
          (Loop *this,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *ordered_loop_blocks,bool include_pre_header,bool include_merge)

{
  pointer *pppBVar1;
  IRContext *pIVar2;
  CFG *this_00;
  iterator iVar3;
  undefined8 uVar4;
  _Any_data *p_Var5;
  _Any_data *p_Var6;
  bool bVar7;
  FeatureManager *pFVar8;
  BasicBlock *bb;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  BasicBlock *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  this_00 = (pIVar2->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::reserve
            (ordered_loop_blocks,
             (ulong)include_merge + (ulong)include_pre_header +
             (this->loop_basic_blocks_)._M_h._M_element_count);
  if ((include_pre_header) && (this->loop_preheader_ != (BasicBlock *)0x0)) {
    iVar3._M_current =
         (ordered_loop_blocks->
         super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (ordered_loop_blocks->
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
      _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                 ordered_loop_blocks,iVar3,&this->loop_preheader_);
    }
    else {
      *iVar3._M_current = this->loop_preheader_;
      pppBVar1 = &(ordered_loop_blocks->
                  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  pIVar2 = this->context_;
  pFVar8 = (pIVar2->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar8 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar2);
    pFVar8 = (pIVar2->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar7 = EnumSet<spv::Capability>::contains(&pFVar8->capabilities_,Shader);
  if (bVar7) {
    local_40 = (code *)0x0;
    local_50._M_unused._M_object = &local_50;
    local_50._8_8_ = &local_50;
    CFG::ComputeStructuredOrder
              (this_00,this->loop_header_->function_,this->loop_header_,this->loop_merge_,
               (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               &local_50);
    for (uVar4 = local_50._M_unused._0_8_;
        (p_Var6 = (_Any_data *)local_50._M_unused._0_8_, (_Any_data *)uVar4 != &local_50 &&
        (local_58 = *(BasicBlock **)(uVar4 + 0x10), local_58 != this->loop_merge_));
        uVar4 = *(undefined8 *)uVar4) {
      iVar3._M_current =
           (ordered_loop_blocks->
           super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (ordered_loop_blocks->
          super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
        _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                  ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                   ordered_loop_blocks,iVar3,&local_58);
      }
      else {
        *iVar3._M_current = local_58;
        pppBVar1 = &(ordered_loop_blocks->
                    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
    }
    while (p_Var6 != &local_50) {
      p_Var5 = *(_Any_data **)p_Var6;
      operator_delete(p_Var6,0x18);
      p_Var6 = p_Var5;
    }
  }
  else {
    local_38 = std::
               _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:485:23)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:485:23)>
               ::_M_manager;
    local_50._M_unused._M_object = ordered_loop_blocks;
    local_50._8_8_ = this;
    CFG::ForEachBlockInReversePostOrder
              (this_00,this->loop_header_,(function<void_(spvtools::opt::BasicBlock_*)> *)&local_50)
    ;
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,3);
    }
  }
  if ((include_merge) && (this->loop_merge_ != (BasicBlock *)0x0)) {
    iVar3._M_current =
         (ordered_loop_blocks->
         super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (ordered_loop_blocks->
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
      _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                 ordered_loop_blocks,iVar3,&this->loop_merge_);
    }
    else {
      *iVar3._M_current = this->loop_merge_;
      pppBVar1 = &(ordered_loop_blocks->
                  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  return;
}

Assistant:

void Loop::ComputeLoopStructuredOrder(
    std::vector<BasicBlock*>* ordered_loop_blocks, bool include_pre_header,
    bool include_merge) const {
  CFG& cfg = *context_->cfg();

  // Reserve the memory: all blocks in the loop + extra if needed.
  ordered_loop_blocks->reserve(GetBlocks().size() + include_pre_header +
                               include_merge);

  if (include_pre_header && GetPreHeaderBlock())
    ordered_loop_blocks->push_back(loop_preheader_);

  bool is_shader =
      context_->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  if (!is_shader) {
    cfg.ForEachBlockInReversePostOrder(
        loop_header_, [ordered_loop_blocks, this](BasicBlock* bb) {
          if (IsInsideLoop(bb)) ordered_loop_blocks->push_back(bb);
        });
  } else {
    // If this is a shader, it is possible that there are unreachable merge and
    // continue blocks that must be copied to retain the structured order.
    // The structured order will include these.
    std::list<BasicBlock*> order;
    cfg.ComputeStructuredOrder(loop_header_->GetParent(), loop_header_,
                               loop_merge_, &order);
    for (BasicBlock* bb : order) {
      if (bb == GetMergeBlock()) {
        break;
      }
      ordered_loop_blocks->push_back(bb);
    }
  }
  if (include_merge && GetMergeBlock())
    ordered_loop_blocks->push_back(loop_merge_);
}